

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_tracker_connection.hpp
# Opt level: O0

shared_ptr<libtorrent::aux::udp_tracker_connection> __thiscall
libtorrent::aux::udp_tracker_connection::shared_from_this(udp_tracker_connection *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<libtorrent::aux::udp_tracker_connection> sVar1;
  undefined1 local_28 [24];
  udp_tracker_connection *this_local;
  
  this_local = this;
  tracker_connection::shared_from_this((tracker_connection *)local_28);
  ::std::
  static_pointer_cast<libtorrent::aux::udp_tracker_connection,libtorrent::aux::tracker_connection>
            ((shared_ptr<libtorrent::aux::tracker_connection> *)this);
  ::std::shared_ptr<libtorrent::aux::tracker_connection>::~shared_ptr
            ((shared_ptr<libtorrent::aux::tracker_connection> *)local_28);
  sVar1.super___shared_ptr<libtorrent::aux::udp_tracker_connection,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<libtorrent::aux::udp_tracker_connection,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = this;
  return (shared_ptr<libtorrent::aux::udp_tracker_connection>)
         sVar1.
         super___shared_ptr<libtorrent::aux::udp_tracker_connection,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<udp_tracker_connection> shared_from_this()
		{
			return std::static_pointer_cast<udp_tracker_connection>(
				tracker_connection::shared_from_this());
		}